

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.cc
# Opt level: O2

VariableIndex __thiscall dynet::ComputationGraph::add_parameters(ComputationGraph *this,Parameter p)

{
  ParameterNode *this_00;
  ParameterStorage *pPVar1;
  VariableIndex new_node_index;
  VariableIndex local_2c;
  Parameter local_28;
  ParameterNode *local_20;
  
  local_2c = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  local_28.p = p.p;
  this_00 = (ParameterNode *)operator_new(0x98);
  ParameterNode::ParameterNode(this_00,&local_28);
  local_20 = this_00;
  std::vector<dynet::Node*,std::allocator<dynet::Node*>>::emplace_back<dynet::Node*>
            ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,(Node **)&local_20);
  pPVar1 = Parameter::get_storage(&local_28);
  (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1]->device = pPVar1->device;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->parameter_nodes,&local_2c);
  set_dim_for_new_node(this,&local_2c);
  return local_2c;
}

Assistant:

VariableIndex ComputationGraph::add_parameters(Parameter p) {
  VariableIndex new_node_index(nodes.size());
  ParameterNode* new_node = new ParameterNode(p);
  nodes.push_back(new_node);
  nodes.back()->device = p.get_storage().device;
  parameter_nodes.push_back(new_node_index);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}